

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convertpng.c
# Opt level: O2

opj_image_t * pngtoimage(char *read_idf,opj_cparameters_t *params)

{
  undefined8 uVar1;
  undefined4 uVar2;
  uint uVar3;
  OPJ_UINT32 OVar4;
  OPJ_UINT32 OVar5;
  opj_image_comp_t *poVar6;
  opj_cparameters_t *poVar7;
  byte bVar8;
  int iVar9;
  FILE *__stream;
  size_t sVar10;
  png_structp ppVar11;
  png_infop ppVar12;
  __jmp_buf_tag *__env;
  void *__ptr;
  void *pvVar13;
  opj_image_t *poVar14;
  opj_image_t *__ptr_00;
  png_uint_32 pVar15;
  char *__format;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  png_uint_32 height;
  png_uint_32 width;
  int color_type;
  int bit_depth;
  png_structp png;
  uint local_138;
  undefined4 local_134;
  double gamma;
  png_infop info;
  opj_image_t *local_120;
  convert_XXx32s_C1R local_118;
  convert_32s_CXPX local_110;
  opj_cparameters_t *local_108;
  int filter_type;
  int compression_type;
  int interlace_type;
  OPJ_BYTE sigbuf [8];
  OPJ_INT32 *planes [4];
  opj_image_cmptparm_t cmptparm [4];
  
  png = (png_structp)0x0;
  info = (png_infop)0x0;
  height = 0;
  __stream = fopen(read_idf,"rb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"pngtoimage: can not open %s\n",read_idf);
    return (opj_image_t *)0x0;
  }
  sVar10 = fread(sigbuf,1,8,__stream);
  if ((sVar10 == 8) && (sigbuf == (OPJ_BYTE  [8])0xa1a0a0d474e5089)) {
    __ptr_00 = (opj_image_t *)0x0;
    ppVar11 = (png_structp)png_create_read_struct("1.6.37",0,0,0);
    poVar14 = __ptr_00;
    png = ppVar11;
    if (ppVar11 == (png_structp)0x0) goto LAB_00111bed;
    ppVar12 = (png_infop)png_create_info_struct(ppVar11);
    info = ppVar12;
    if (ppVar12 != (png_infop)0x0) {
      __env = (__jmp_buf_tag *)png_set_longjmp_fn(ppVar11,longjmp,200);
      iVar9 = _setjmp(__env);
      if (iVar9 == 0) {
        png_init_io(ppVar11,__stream);
        png_set_sig_bytes(ppVar11,8);
        png_read_info(ppVar11,ppVar12);
        iVar9 = png_get_IHDR(ppVar11,ppVar12,&width,&height,&bit_depth,&color_type,&interlace_type,
                             &compression_type,&filter_type);
        if (iVar9 != 0) {
          if (color_type == 3) {
            png_set_expand(ppVar11);
          }
          iVar9 = png_get_valid(ppVar11,ppVar12,0x10);
          if (iVar9 != 0) {
            png_set_expand(ppVar11);
          }
          iVar9 = png_get_gAMA(ppVar11,ppVar12,&gamma);
          if (iVar9 == 0) {
            gamma = 1.0;
          }
          png_set_gamma(0x3ff0000000000000,gamma,ppVar11);
          png_read_update_info(ppVar11,ppVar12);
          bVar8 = png_get_color_type(ppVar11,ppVar12);
          color_type = (int)bVar8;
          if ((bVar8 < 7) && ((0x55U >> (color_type & 0x1fU) & 1) != 0)) {
            uVar2 = *(undefined4 *)(&DAT_00116d44 + (ulong)bVar8 * 4);
            uVar3 = *(uint *)(&DAT_00116d60 + (ulong)bVar8 * 4);
            uVar18 = (ulong)uVar3;
            local_110 = convert_32s_CXPX_LUT[uVar18];
            bVar8 = png_get_bit_depth(ppVar11,ppVar12);
            bit_depth = (int)bVar8;
            if (bVar8 < 0x11) {
              if ((0x116U >> (bit_depth & 0x1fU) & 1) == 0) {
                if (bVar8 != 0x10) goto LAB_00111fc3;
                local_118 = convert_16u32s_C1R;
              }
              else {
                local_118 = convert_XXu32s_C1R_LUT[(uint)bVar8];
              }
              __ptr = calloc((ulong)(height + 1),8);
              if (__ptr != (void *)0x0) {
                uVar19 = 0;
                local_134 = uVar2;
                local_108 = params;
LAB_00111d49:
                if (uVar19 < height) goto code_r0x00111d52;
                png_read_image(ppVar11,__ptr);
                memset(cmptparm,0,0x90);
                poVar7 = local_108;
                uVar1 = *(undefined8 *)&local_108->subsampling_dx;
                for (lVar16 = 0; uVar18 * 0x24 - lVar16 != 0; lVar16 = lVar16 + 0x24) {
                  *(int *)((long)&cmptparm[0].prec + lVar16) = bit_depth;
                  *(int *)((long)&cmptparm[0].bpp + lVar16) = bit_depth;
                  *(undefined4 *)((long)&cmptparm[0].sgnd + lVar16) = 0;
                  *(undefined8 *)((long)&cmptparm[0].dx + lVar16) = uVar1;
                  *(png_uint_32 *)((long)&cmptparm[0].w + lVar16) = width;
                  *(png_uint_32 *)((long)&cmptparm[0].h + lVar16) = height;
                }
                poVar14 = (opj_image_t *)opj_image_create(uVar3,cmptparm,local_134);
                pVar15 = width;
                if (poVar14 == (opj_image_t *)0x0) goto LAB_00111ed1;
                OVar4 = poVar7->image_offset_x0;
                poVar14->x0 = OVar4;
                OVar5 = poVar7->image_offset_y0;
                poVar14->y0 = OVar5;
                poVar14->x1 = (width - 1) * poVar7->subsampling_dx + OVar4 * 2 + 1;
                local_138 = height;
                poVar14->y1 = (height - 1) * poVar7->subsampling_dy + OVar5 * 2 + 1;
                __ptr_00 = (opj_image_t *)malloc(width * uVar18 * 4);
                if (__ptr_00 == (opj_image_t *)0x0) {
                  __ptr_00 = (opj_image_t *)0x0;
                }
                else {
                  poVar6 = poVar14->comps;
                  poVar6[uVar18 - 1].alpha = ~(ushort)uVar3 & 1;
                  for (lVar16 = 0; uVar18 * 8 - lVar16 != 0; lVar16 = lVar16 + 8) {
                    *(OPJ_INT32 **)((long)planes + lVar16) = (&poVar6->data)[lVar16];
                  }
                  uVar19 = (ulong)pVar15;
                  pVar15 = local_138;
                  local_120 = poVar14;
                  for (uVar17 = 0; poVar14 = local_120, uVar17 < pVar15; uVar17 = uVar17 + 1) {
                    (*local_118)(*(OPJ_BYTE **)((long)__ptr + uVar17 * 8),(OPJ_INT32 *)__ptr_00,
                                 uVar19 * uVar18);
                    (*local_110)((OPJ_INT32 *)__ptr_00,planes,(OPJ_SIZE_T)width);
                    uVar19 = (ulong)width;
                    planes[0] = planes[0] + uVar19;
                    planes[1] = planes[1] + uVar19;
                    planes[2] = planes[2] + uVar19;
                    planes[3] = planes[3] + uVar19;
                    pVar15 = height;
                  }
                }
                goto LAB_00111f57;
              }
              fwrite("pngtoimage: memory out\n",0x17,1,_stderr);
              goto LAB_00111bea;
            }
LAB_00111fc3:
            __format = "pngtoimage: bit depth %d is not supported\n";
          }
          else {
            __format = "pngtoimage: colortype %d is not supported\n";
          }
          fprintf(_stderr,__format);
        }
      }
    }
  }
  else {
    fprintf(_stderr,"pngtoimage: %s is no valid PNG file\n",read_idf);
  }
LAB_00111bea:
  __ptr_00 = (opj_image_t *)0x0;
  poVar14 = __ptr_00;
LAB_00111bed:
  free(__ptr_00);
  if (png != (png_structp)0x0) {
    png_destroy_read_struct(&png,&info,0);
  }
  fclose(__stream);
  return poVar14;
code_r0x00111d52:
  sVar10 = png_get_rowbytes(ppVar11,ppVar12);
  pvVar13 = malloc(sVar10);
  *(void **)((long)__ptr + uVar19 * 8) = pvVar13;
  uVar19 = uVar19 + 1;
  if (pvVar13 == (void *)0x0) goto code_r0x00111d71;
  goto LAB_00111d49;
code_r0x00111d71:
  fwrite("pngtoimage: memory out\n",0x17,1,_stderr);
LAB_00111ed1:
  __ptr_00 = (opj_image_t *)0x0;
  poVar14 = __ptr_00;
LAB_00111f57:
  for (uVar18 = 0; uVar18 < height; uVar18 = uVar18 + 1) {
    free(*(void **)((long)__ptr + uVar18 * 8));
  }
  free(__ptr);
  goto LAB_00111bed;
}

Assistant:

opj_image_t *pngtoimage(const char *read_idf, opj_cparameters_t * params)
{
    png_structp  png = NULL;
    png_infop    info = NULL;
    double gamma;
    int bit_depth, interlace_type, compression_type, filter_type;
    OPJ_UINT32 i;
    png_uint_32  width, height = 0U;
    int color_type;
    FILE *reader = NULL;
    OPJ_BYTE** rows = NULL;
    OPJ_INT32* row32s = NULL;
    /* j2k: */
    opj_image_t *image = NULL;
    opj_image_cmptparm_t cmptparm[4];
    OPJ_UINT32 nr_comp;
    OPJ_BYTE sigbuf[8];
    convert_XXx32s_C1R cvtXXTo32s = NULL;
    convert_32s_CXPX cvtCxToPx = NULL;
    OPJ_INT32* planes[4];

    if ((reader = fopen(read_idf, "rb")) == NULL) {
        fprintf(stderr, "pngtoimage: can not open %s\n", read_idf);
        return NULL;
    }

    if (fread(sigbuf, 1, MAGIC_SIZE, reader) != MAGIC_SIZE
            || memcmp(sigbuf, PNG_MAGIC, MAGIC_SIZE) != 0) {
        fprintf(stderr, "pngtoimage: %s is no valid PNG file\n", read_idf);
        goto fin;
    }

    if ((png = png_create_read_struct(PNG_LIBPNG_VER_STRING,
                                      NULL, NULL, NULL)) == NULL) {
        goto fin;
    }
    if ((info = png_create_info_struct(png)) == NULL) {
        goto fin;
    }

    if (setjmp(png_jmpbuf(png))) {
        goto fin;
    }

    png_init_io(png, reader);
    png_set_sig_bytes(png, MAGIC_SIZE);

    png_read_info(png, info);

    if (png_get_IHDR(png, info, &width, &height,
                     &bit_depth, &color_type, &interlace_type,
                     &compression_type, &filter_type) == 0) {
        goto fin;
    }

    /* png_set_expand():
     * expand paletted images to RGB, expand grayscale images of
     * less than 8-bit depth to 8-bit depth, and expand tRNS chunks
     * to alpha channels.
     */
    if (color_type == PNG_COLOR_TYPE_PALETTE) {
        png_set_expand(png);
    }

    if (png_get_valid(png, info, PNG_INFO_tRNS)) {
        png_set_expand(png);
    }
    /* We might wan't to expand background */
    /*
    if(png_get_valid(png, info, PNG_INFO_bKGD)) {
        png_color_16p bgnd;
        png_get_bKGD(png, info, &bgnd);
        png_set_background(png, bgnd, PNG_BACKGROUND_GAMMA_FILE, 1, 1.0);
    }
    */

    if (!png_get_gAMA(png, info, &gamma)) {
        gamma = 1.0;
    }

    /* we're not displaying but converting, screen gamma == 1.0 */
    png_set_gamma(png, 1.0, gamma);

    png_read_update_info(png, info);

    color_type = png_get_color_type(png, info);

    switch (color_type) {
    case PNG_COLOR_TYPE_GRAY:
        nr_comp = 1;
        break;
    case PNG_COLOR_TYPE_GRAY_ALPHA:
        nr_comp = 2;
        break;
    case PNG_COLOR_TYPE_RGB:
        nr_comp = 3;
        break;
    case PNG_COLOR_TYPE_RGB_ALPHA:
        nr_comp = 4;
        break;
    default:
        fprintf(stderr, "pngtoimage: colortype %d is not supported\n", color_type);
        goto fin;
    }
    cvtCxToPx = convert_32s_CXPX_LUT[nr_comp];
    bit_depth = png_get_bit_depth(png, info);

    switch (bit_depth) {
    case 1:
    case 2:
    case 4:
    case 8:
        cvtXXTo32s = convert_XXu32s_C1R_LUT[bit_depth];
        break;
    case 16: /* 16 bpp is specific to PNG */
        cvtXXTo32s = convert_16u32s_C1R;
        break;
    default:
        fprintf(stderr, "pngtoimage: bit depth %d is not supported\n", bit_depth);
        goto fin;
    }


    rows = (OPJ_BYTE**)calloc(height + 1, sizeof(OPJ_BYTE*));
    if (rows == NULL) {
        fprintf(stderr, "pngtoimage: memory out\n");
        goto fin;
    }
    for (i = 0; i < height; ++i) {
        rows[i] = (OPJ_BYTE*)malloc(png_get_rowbytes(png, info));
        if (rows[i] == NULL) {
            fprintf(stderr, "pngtoimage: memory out\n");
            goto fin;
        }
    }
    png_read_image(png, rows);

    /* Create image */
    memset(cmptparm, 0, sizeof(cmptparm));
    for (i = 0; i < nr_comp; ++i) {
        cmptparm[i].prec = (OPJ_UINT32)bit_depth;
        /* bits_per_pixel: 8 or 16 */
        cmptparm[i].bpp = (OPJ_UINT32)bit_depth;
        cmptparm[i].sgnd = 0;
        cmptparm[i].dx = (OPJ_UINT32)params->subsampling_dx;
        cmptparm[i].dy = (OPJ_UINT32)params->subsampling_dy;
        cmptparm[i].w = (OPJ_UINT32)width;
        cmptparm[i].h = (OPJ_UINT32)height;
    }

    image = opj_image_create(nr_comp, &cmptparm[0],
                             (nr_comp > 2U) ? OPJ_CLRSPC_SRGB : OPJ_CLRSPC_GRAY);
    if (image == NULL) {
        goto fin;
    }
    image->x0 = (OPJ_UINT32)params->image_offset_x0;
    image->y0 = (OPJ_UINT32)params->image_offset_y0;
    image->x1 = (OPJ_UINT32)(image->x0 + (width  - 1) * (OPJ_UINT32)
                             params->subsampling_dx + 1 + image->x0);
    image->y1 = (OPJ_UINT32)(image->y0 + (height - 1) * (OPJ_UINT32)
                             params->subsampling_dy + 1 + image->y0);

    row32s = (OPJ_INT32 *)malloc((size_t)width * nr_comp * sizeof(OPJ_INT32));
    if (row32s == NULL) {
        goto fin;
    }

    /* Set alpha channel */
    image->comps[nr_comp - 1U].alpha = 1U - (nr_comp & 1U);

    for (i = 0; i < nr_comp; i++) {
        planes[i] = image->comps[i].data;
    }

    for (i = 0; i < height; ++i) {
        cvtXXTo32s(rows[i], row32s, (OPJ_SIZE_T)width * nr_comp);
        cvtCxToPx(row32s, planes, width);
        planes[0] += width;
        planes[1] += width;
        planes[2] += width;
        planes[3] += width;
    }
fin:
    if (rows) {
        for (i = 0; i < height; ++i)
            if (rows[i]) {
                free(rows[i]);
            }
        free(rows);
    }
    if (row32s) {
        free(row32s);
    }
    if (png) {
        png_destroy_read_struct(&png, &info, NULL);
    }

    fclose(reader);

    return image;

}